

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O0

hrgls_Status
hrgls_APISetLogMessageCallback(hrgls_API api,hrgls_LogMessageCallback handler,void *userData)

{
  void *userData_local;
  hrgls_LogMessageCallback handler_local;
  hrgls_API api_local;
  
  if (api == (hrgls_API)0x0) {
    api_local._4_4_ = 0x3ee;
  }
  else {
    api->CHandler = handler;
    api->CUserData = userData;
    if (handler == (hrgls_LogMessageCallback)0x0) {
      api_local._4_4_ =
           hrgls::API::SetLogMessageCallback(api->api,(LogMessageCallback)0x0,(void *)0x0);
    }
    else {
      api_local._4_4_ = hrgls::API::SetLogMessageCallback(api->api,LogMessageCallback,api);
    }
  }
  return api_local._4_4_;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_APISetLogMessageCallback(hrgls_API api,
    hrgls_LogMessageCallback handler, void *userData)
  {
    if (!api) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    api->CHandler = handler;
    api->CUserData = userData;
    // If we are supposed to be calling a callback handler, then set our callback handler
    // as the intercept.  If not, then set it to nullptr so that no callbacks are called.
    try {
      if (!handler) {
        return api->api->SetLogMessageCallback(nullptr, nullptr);
      }
      return api->api->SetLogMessageCallback(LogMessageCallback, api);
    } catch (...) {
      return hrgls_STATUS_INTERNAL_EXCEPTION;
    }
  }